

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O0

EStatusCode __thiscall
AbstractContentContext::re
          (AbstractContentContext *this,double inLeft,double inBottom,double inWidth,double inHeight
          )

{
  EStatusCode EVar1;
  double inHeight_local;
  double inWidth_local;
  double inBottom_local;
  double inLeft_local;
  AbstractContentContext *this_local;
  
  RenewStreamConnectAndStoreResult(this);
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  PrimitiveObjectsWriter::WriteDouble(&this->mPrimitiveWriter,inLeft,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(&this->mPrimitiveWriter,inBottom,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(&this->mPrimitiveWriter,inWidth,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(&this->mPrimitiveWriter,inHeight,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&scAddRectangleToPath_abi_cxx11_);
  EVar1 = GetCurrentStatusCode(this);
  return EVar1;
}

Assistant:

EStatusCode AbstractContentContext::re(double inLeft,double inBottom, double inWidth,double inHeight)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);

	mPrimitiveWriter.WriteDouble(inLeft);
	mPrimitiveWriter.WriteDouble(inBottom);
	mPrimitiveWriter.WriteDouble(inWidth);
	mPrimitiveWriter.WriteDouble(inHeight);
	mPrimitiveWriter.WriteKeyword(scAddRectangleToPath);
	return GetCurrentStatusCode();
}